

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

bool divsufsortxx::helper::
     partition<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
               (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator first1,
               iterator first2,iterator last,iterator *mfirst,iterator *mlast,value_type *v)

{
  reference rhs;
  reference rhs_00;
  reference rhs_01;
  reference rhs_02;
  reference rhs_03;
  iterator first2_00;
  iterator first2_01;
  reference lhs;
  reference lhs_00;
  reference lhs_01;
  reference lhs_02;
  reference lhs_03;
  value_type vVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar3;
  BitmapArray<long> *pBVar4;
  BitmapArray<long> *pBVar5;
  BitmapArray<long> *pBVar6;
  BitmapArray<long> *pBVar7;
  long lVar8;
  BitmapArray<long> *pBVar9;
  BitmapArray<long> *this;
  BitmapArray<long> *pBVar10;
  pos_type pVar11;
  BitmapArray<long> *pBVar12;
  long lVar13;
  iterator first1_00;
  iterator first1_01;
  iterator last1;
  iterator last1_00;
  BitmapArray<long> *in_stack_ffffffffffffffb0;
  BitmapArray<long> *pBVar14;
  
  this = last.array_;
  first1_00.pos_ = first2.array_;
  pVar11 = first1.pos_;
  pBVar10 = (BitmapArray<long> *)last.pos_;
  for (pBVar5 = (BitmapArray<long> *)first2.pos_; pBVar6 = pBVar10, pBVar4 = pBVar5, pBVar9 = pBVar5
      , pBVar5 < (BitmapArray<long> *)last.pos_;
      pBVar5 = (BitmapArray<long> *)((long)&(pBVar5->super_Bitmap)._vptr_Bitmap + 1)) {
    iVar2 = (*((first1_00.pos_)->super_Bitmap)._vptr_Bitmap[5])(first1_00.pos_,pBVar5);
    vVar1 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                      (&Td,CONCAT44(extraout_var,iVar2));
    if (vVar1 != *v) {
      pBVar6 = pBVar10;
      if (vVar1 < *v) goto LAB_0010a3d7;
      break;
    }
  }
  goto LAB_0010a437;
LAB_0010a3d7:
  pBVar9 = (BitmapArray<long> *)((long)&(pBVar5->super_Bitmap)._vptr_Bitmap + 1);
  pBVar6 = pBVar10;
  if (pBVar9 < pBVar10) {
    iVar2 = (*((first1_00.pos_)->super_Bitmap)._vptr_Bitmap[5])(first1_00.pos_,pBVar9);
    vVar1 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                      (&Td,CONCAT44(extraout_var_00,iVar2));
    pBVar6 = pBVar10;
    if (*v < vVar1) goto LAB_0010a437;
    pBVar5 = (BitmapArray<long> *)((long)&(pBVar5->super_Bitmap)._vptr_Bitmap + 1);
    if (vVar1 == *v) {
      lhs.pos_ = (pos_type)pBVar10;
      lhs.array_ = in_stack_ffffffffffffffb0;
      rhs.pos_ = (pos_type)pBVar4;
      rhs.array_ = (BitmapArray<long> *)0x10a425;
      bitmap::swap(lhs,rhs);
      pBVar4 = (BitmapArray<long> *)((long)&(pBVar4->super_Bitmap)._vptr_Bitmap + 1);
    }
    goto LAB_0010a3d7;
  }
LAB_0010a437:
  do {
    pBVar5 = pBVar6;
    pBVar6 = (BitmapArray<long> *)&pBVar5[-1].field_0x27;
    if (pBVar6 <= pBVar9) goto LAB_0010a4d1;
    iVar2 = (*(this->super_Bitmap)._vptr_Bitmap[5])(this,pBVar6);
    vVar1 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                      (&Td,CONCAT44(extraout_var_01,iVar2));
  } while (vVar1 == *v);
  pBVar12 = pBVar6;
  if (*v < vVar1) {
    while (pBVar5 = (BitmapArray<long> *)&pBVar6[-1].field_0x27, pBVar7 = pBVar9, pBVar9 < pBVar5) {
      iVar2 = (*(this->super_Bitmap)._vptr_Bitmap[5])(this);
      vVar1 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                        (&Td,CONCAT44(extraout_var_02,iVar2));
      if (vVar1 < *v) {
        pBVar7 = (BitmapArray<long> *)&pBVar6[-1].field_0x27;
        break;
      }
      pBVar6 = pBVar5;
      if (vVar1 == *v) {
        lhs_00.pos_ = (pos_type)pBVar10;
        lhs_00.array_ = pBVar5;
        rhs_00.pos_ = (pos_type)pBVar4;
        rhs_00.array_ = (BitmapArray<long> *)0x10a4c7;
        bitmap::swap(lhs_00,rhs_00);
        pBVar12 = (BitmapArray<long> *)&pBVar12[-1].field_0x27;
      }
    }
  }
  else {
LAB_0010a4d1:
    pBVar12 = (BitmapArray<long> *)&pBVar5[-1].field_0x27;
    pBVar7 = pBVar12;
  }
LAB_0010a4d7:
  do {
    if (pBVar7 <= pBVar9) {
      if (pBVar4 <= pBVar12) {
        lVar8 = (long)pBVar9 - (long)pBVar4;
        lVar3 = (long)pBVar4 - pVar11;
        if (lVar8 < (long)((long)pBVar4 - pVar11)) {
          lVar3 = lVar8;
        }
        first1_00.array_ = (BitmapArray<long> *)((long)pBVar9 - lVar3);
        first2_00.pos_ = (pos_type)pBVar12;
        first2_00.array_ = pBVar4;
        last1.pos_ = (pos_type)first1.array_;
        last1.array_ = pBVar9;
        vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  ((helper *)first1_00.pos_,first1_00,last1,first2_00);
        lVar13 = (long)pBVar12 + (1 - (long)pBVar9);
        lVar3 = (long)&(pBVar10->super_Bitmap)._vptr_Bitmap + ~(ulong)pBVar12;
        if (lVar13 <= lVar3) {
          lVar3 = lVar13;
        }
        first1_01.array_ = (BitmapArray<long> *)((long)pBVar10 - lVar3);
        first2_01.pos_ = (pos_type)pBVar12;
        first2_01.array_ = pBVar4;
        first1_01.pos_ = (pos_type)this;
        last1_00.pos_ = (pos_type)first1_00.pos_;
        last1_00.array_ = pBVar10;
        vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  ((helper *)this,first1_01,last1_00,first2_01);
        pVar11 = pVar11 + lVar8;
        pBVar10 = (BitmapArray<long> *)((long)pBVar10 - lVar13);
      }
      mfirst->array_ = first1.array_;
      mfirst->pos_ = pVar11;
      mlast->array_ = this;
      mlast->pos_ = (pos_type)pBVar10;
      return pBVar4 <= pBVar12;
    }
    lhs_01.pos_ = (pos_type)pBVar10;
    lhs_01.array_ = pBVar12;
    rhs_01.pos_ = (pos_type)pBVar4;
    rhs_01.array_ = (BitmapArray<long> *)0x10a4f6;
    bitmap::swap(lhs_01,rhs_01);
    pBVar5 = pBVar9;
    while (pBVar6 = (BitmapArray<long> *)((long)&(pBVar5->super_Bitmap)._vptr_Bitmap + 1),
          pBVar14 = pBVar12, pBVar9 = pBVar7, pBVar6 < pBVar7) {
      iVar2 = (*((first1_00.pos_)->super_Bitmap)._vptr_Bitmap[5])(first1_00.pos_,pBVar6);
      vVar1 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                        (&Td,CONCAT44(extraout_var_03,iVar2));
      if (*v < vVar1) {
        pBVar14 = pBVar12;
        pBVar9 = (BitmapArray<long> *)((long)&(pBVar5->super_Bitmap)._vptr_Bitmap + 1);
        break;
      }
      pBVar5 = pBVar6;
      if (vVar1 == *v) {
        lhs_02.pos_ = (pos_type)pBVar10;
        lhs_02.array_ = pBVar12;
        rhs_02.pos_ = (pos_type)pBVar4;
        rhs_02.array_ = (BitmapArray<long> *)0x10a541;
        bitmap::swap(lhs_02,rhs_02);
        pBVar4 = (BitmapArray<long> *)((long)&(pBVar4->super_Bitmap)._vptr_Bitmap + 1);
      }
    }
LAB_0010a557:
    pBVar7 = (BitmapArray<long> *)&pBVar7[-1].field_0x27;
  } while (pBVar7 <= pBVar9);
  iVar2 = (*(this->super_Bitmap)._vptr_Bitmap[5])(this,pBVar7);
  vVar1 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (&Td,CONCAT44(extraout_var_04,iVar2));
  if (vVar1 < *v) goto LAB_0010a4d7;
  if (vVar1 == *v) {
    pBVar12 = (BitmapArray<long> *)&pBVar12[-1].field_0x27;
    lhs_03.pos_ = (pos_type)pBVar10;
    lhs_03.array_ = pBVar14;
    rhs_03.pos_ = (pos_type)pBVar4;
    rhs_03.array_ = (BitmapArray<long> *)0x10a5a0;
    bitmap::swap(lhs_03,rhs_03);
  }
  goto LAB_0010a557;
}

Assistant:

bool partition(
    const StringIterator_type Td, SAIterator_type first1,
    SAIterator_type first2, SAIterator_type last, SAIterator_type &mfirst,
    SAIterator_type &mlast,
    const typename std::iterator_traits<StringIterator_type>::value_type &v) {
  SAIterator_type a, b, c, d;
  typename std::iterator_traits<StringIterator_type>::value_type x = 0;

  for (b = first2; (b < last) && ((x = Td[*b]) == v); ++b) {
  }
  if (((a = b) < last) && (x < v)) {
    for (; (++b < last) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
  }
  for (c = last; (b < --c) && ((x = Td[*c]) == v);) {
  }
  if ((b < (d = c)) && (x > v)) {
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }
  for (; b < c;) {
    std::iter_swap(b, c);
    for (; (++b < c) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }

  if (a <= d) {
    vecswap(b - std::min(a - first1, b - a), b, first1);
    vecswap(last - std::min(d + 1 - b, last - d - 1), last, b);
    mfirst = first1 + (b - a), mlast = last - (d + 1 - b);
    return true;
  }
  mfirst = first1, mlast = last;
  return false;
}